

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O1

void empty_port::impl<(empty_port::Kind)0>::fill_struct
               (socket_t *param_1,sockaddr_in *addr,port_t port,char *host)

{
  int __errnum;
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  addrinfo *result;
  addrinfo hints;
  addrinfo *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  addrinfo local_58;
  
  addr->sin_family = 0;
  addr->sin_port = 0;
  addr->sin_addr = 0;
  addr->sin_zero[0] = '\0';
  addr->sin_zero[1] = '\0';
  addr->sin_zero[2] = '\0';
  addr->sin_zero[3] = '\0';
  addr->sin_zero[4] = '\0';
  addr->sin_zero[5] = '\0';
  addr->sin_zero[6] = '\0';
  addr->sin_zero[7] = '\0';
  addr->sin_family = 2;
  addr->sin_port = port << 8 | port >> 8;
  local_a0 = (addrinfo *)0x0;
  local_58.ai_flags = 0;
  local_58.ai_protocol = 0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_family = 2;
  local_58.ai_socktype = 1;
  __errnum = getaddrinfo(host,(char *)0x0,&local_58,&local_a0);
  if (__errnum == 0) {
    (addr->sin_addr).s_addr = *(in_addr_t *)(local_a0->ai_addr->sa_data + 2);
    freeaddrinfo(local_a0);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Cannot getaddrinfo:: ","");
  strerror(__errnum);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_78);
  local_98 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_98 == plVar2) {
    local_88 = *plVar2;
    lStack_80 = plVar1[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar2;
  }
  local_90 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_98);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void impl<TCP>::fill_struct(const socket_t & /*socket*/, sockaddr_in &addr,
                                   const port_t port, const char *host) {
    std::memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);

    struct addrinfo hints, *result = NULL;
    std::memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_INET;
    hints.ai_socktype = SOCK_STREAM;

    struct sockaddr_in *host_addr;
    // looks up IPv4/IPv6 address by host name or stringized IP address
    int r = getaddrinfo(host, NULL, &hints, &result);
    if (r) {
        throw std::runtime_error(std::string("Cannot getaddrinfo:: ") +
                                 strerror(r));
    }
    host_addr = (struct sockaddr_in *)result->ai_addr;
    memcpy(&addr.sin_addr, &host_addr->sin_addr, sizeof(struct in_addr));
    freeaddrinfo(result);
}